

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::encodeDifference(void *data,int size,DataType dt)

{
  int in_EDX;
  int in_ESI;
  unsigned_short *in_RDI;
  
  if (in_EDX == 0) {
    anon_unknown_1::encodeDifference<unsigned_char>((uchar *)in_RDI,in_ESI);
  }
  else if (in_EDX == 1) {
    anon_unknown_1::encodeDifference<unsigned_short>(in_RDI,in_ESI);
  }
  return;
}

Assistant:

void encodeDifference(void* data, int size, DataType dt)
{
    switch (dt) {
    case dt_uint8:    encodeDifference(static_cast<uint8_t*>(data), size); break;
    case dt_uint16:   encodeDifference(static_cast<uint16_t*>(data), size); break;
    default: break; // skip other types
    }
}